

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_bitmap_of_64(void **param_1)

{
  bool bVar1;
  size_type in_RCX;
  size_type sVar2;
  Roaring64Map *this;
  char *__format;
  initializer_list<unsigned_long> l;
  initializer_list<unsigned_long> l_00;
  initializer_list<unsigned_long> l_01;
  initializer_list<unsigned_long> l_02;
  Roaring64Map r3a;
  Roaring64Map r2;
  Roaring64Map r1;
  Roaring64Map r1d;
  Roaring64Map local_108;
  Roaring64Map local_c8;
  Roaring64Map local_90;
  undefined1 local_58 [24];
  Roaring64Map local_40;
  
  this = &local_c8;
  local_c8.roarings._M_t._M_impl._0_8_ = 1;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x4;
  l._M_len = in_RCX;
  l._M_array = (iterator)0x3;
  roaring::Roaring64Map::bitmapOfList(&local_90,this,l);
  roaring::Roaring64Map::printf(&local_90,(char *)this);
  __format = (char *)0x3;
  roaring::Roaring64Map::bitmapOf(&local_c8,3,1,2,4);
  roaring::Roaring64Map::printf(&local_c8,__format);
  bVar1 = roaring::Roaring64Map::operator==(&local_90,&local_c8);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x382);
  local_108.roarings._M_t._M_impl._0_8_ = 1;
  local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x4;
  l_01._M_len = 3;
  l_01._M_array = (iterator)&local_108;
  roaring::Roaring64Map::Roaring64Map((Roaring64Map *)(local_58 + 0x18),l_01);
  bVar1 = roaring::Roaring64Map::operator==(&local_90,(Roaring64Map *)(local_58 + 0x18));
  sVar2 = 0x385;
  _assert_true((ulong)bVar1,"r1 == r1d",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x385);
  local_58._0_8_ = 7;
  local_58._8_8_ = 8;
  local_58._16_8_ = (_Base_ptr)0x9;
  l_00._M_len = sVar2;
  l_00._M_array = (iterator)0x3;
  roaring::Roaring64Map::bitmapOfList(&local_108,(Roaring64Map *)local_58,l_00);
  local_58._0_8_ = 1;
  local_58._8_8_ = 2;
  local_58._16_8_ = (_Base_ptr)0x4;
  l_02._M_len = 3;
  l_02._M_array = (iterator)local_58;
  roaring::Roaring64Map::operator=(&local_108,l_02);
  bVar1 = roaring::Roaring64Map::operator==(&local_90,&local_108);
  _assert_true((ulong)bVar1,"r1 == r3a",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x389);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_108);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)(local_58 + 0x18));
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_c8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_90);
  return;
}

Assistant:

DEFINE_TEST(test_bitmap_of_64) {
    Roaring64Map r1 = Roaring64Map::bitmapOfList({1, 2, 4});
    r1.printf();
    Roaring64Map r2 =
        Roaring64Map::bitmapOf(3, uint64_t(1), uint64_t(2), uint64_t(4));
    r2.printf();
    assert_true(r1 == r2);

    Roaring64Map r1d = {1, 2, 4};
    assert_true(r1 == r1d);

    Roaring64Map r3a = Roaring64Map::bitmapOfList({7, 8, 9});
    r3a = {1, 2, 4};  // overwrite with assignment operator
    assert_true(r1 == r3a);
}